

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O1

streamsize __thiscall
xe::xml::EscapeStreambuf::xsputn(EscapeStreambuf *this,char *s,streamsize count)

{
  ostream *poVar1;
  bool bVar2;
  bool bVar3;
  char *__s;
  long lVar4;
  bool bVar5;
  long lVar6;
  streamsize local_38;
  
  bVar5 = 0 < count;
  if (count < 1) {
    lVar4 = 0;
  }
  else {
    lVar6 = 0;
    lVar4 = 0;
    do {
      switch(s[lVar6]) {
      case '\0':
        __s = "&lt;NUL&gt;";
        break;
      case '\x01':
        __s = "&lt;SOH&gt;";
        break;
      case '\x02':
        __s = "&lt;STX&gt;";
        break;
      case '\x03':
        __s = "&lt;ETX&gt;";
        break;
      case '\x04':
        __s = "&lt;EOT&gt;";
        break;
      case '\x05':
        __s = "&lt;ENQ&gt;";
        break;
      case '\x06':
        __s = "&lt;ACK&gt;";
        break;
      case '\a':
        __s = "&lt;BEL&gt;";
        break;
      case '\b':
        __s = "&lt;BS&gt;";
        break;
      default:
        bVar3 = true;
        __s = (char *)0x0;
        goto LAB_00113d6d;
      case '\v':
        __s = "&lt;VT&gt;";
        break;
      case '\f':
        __s = "&lt;FF&gt;";
        break;
      case '\x0e':
        __s = "&lt;SO&gt;";
        break;
      case '\x0f':
        __s = "&lt;SI&gt;";
        break;
      case '\x10':
        __s = "&lt;DLE&gt;";
        break;
      case '\x11':
        __s = "&lt;DC1&gt;";
        break;
      case '\x12':
        __s = "&lt;DC2&gt;";
        break;
      case '\x13':
        __s = "&lt;DC3&gt;";
        break;
      case '\x14':
        __s = "&lt;DC4&gt;";
        break;
      case '\x15':
        __s = "&lt;NAK&gt;";
        break;
      case '\x16':
        __s = "&lt;SYN&gt;";
        break;
      case '\x17':
        __s = "&lt;ETB&gt;";
        break;
      case '\x18':
        __s = "&lt;CAN&gt;";
        break;
      case '\x19':
        __s = "&lt;EM&gt;";
        break;
      case '\x1a':
        __s = "&lt;SUB&gt;";
        break;
      case '\x1b':
        __s = "&lt;ESC&gt;";
        break;
      case '\x1c':
        __s = "&lt;FS&gt;";
        break;
      case '\x1d':
        __s = "&lt;GS&gt;";
        break;
      case '\x1e':
        __s = "&lt;RS&gt;";
        break;
      case '\x1f':
        __s = "&lt;US&gt;";
        break;
      case '\"':
        __s = "&quot;";
        break;
      case '&':
        __s = "&amp;";
        break;
      case '\'':
        __s = "&apos;";
        break;
      case '<':
        bVar3 = false;
        __s = "&lt;";
        goto LAB_00113d6d;
      case '>':
        __s = "&gt;";
      }
      bVar3 = false;
LAB_00113d6d:
      bVar2 = true;
      if (!bVar3) {
        if ((lVar4 < lVar6) &&
           (std::ostream::write((char *)this->m_dst,(long)(s + lVar4)),
           ((byte)this->m_dst[*(long *)(*(long *)this->m_dst + -0x18) + 0x20] & 5) != 0)) {
          bVar2 = false;
          local_38 = lVar4;
        }
        else {
          poVar1 = this->m_dst;
          strlen(__s);
          std::ostream::write((char *)poVar1,(long)__s);
          lVar4 = lVar6 + 1;
        }
      }
      if (!bVar2) break;
      lVar6 = lVar6 + 1;
      bVar5 = lVar6 < count;
    } while (lVar6 != count);
  }
  if ((!bVar5) &&
     ((count <= lVar4 ||
      (std::ostream::write((char *)this->m_dst,(long)(s + lVar4)), local_38 = lVar4,
      ((byte)this->m_dst[*(long *)(*(long *)this->m_dst + -0x18) + 0x20] & 5) == 0)))) {
    local_38 = count;
  }
  return local_38;
}

Assistant:

std::streamsize EscapeStreambuf::xsputn (const char* s, std::streamsize count)
{
	std::streamsize	numWritten = 0;

	for (std::streamsize inPos = 0; inPos < count; inPos++)
	{
		const char* entity = getEscapeEntity(s[inPos]);

		if (entity)
		{
			// Flush data prior to entity.
			if (inPos > numWritten)
			{
				m_dst.write(s + numWritten, inPos-numWritten);
				if (m_dst.fail())
					return numWritten;
			}

			// Flush entity value
			m_dst.write(entity, (std::streamsize)strlen(entity));

			numWritten = inPos+1;
		}
	}

	if (numWritten < count)
	{
		m_dst.write(s + numWritten, count-numWritten);
		if (m_dst.fail())
			return numWritten;
	}

	return count;
}